

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O3

NodeData * __thiscall IndexTree::search(IndexTree *this,PolarString *key)

{
  int32_t *piVar1;
  long *__s1;
  Node *pNVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int64_t *fast_this;
  
  iVar4 = *this->root_node;
  if (iVar4 != -1) {
    __s1 = (long *)key->data_;
    pNVar2 = this->nodes;
    lVar3 = *__s1;
    do {
      lVar5 = (long)iVar4;
      if (lVar3 == *(long *)pNVar2[lVar5].key) {
        iVar4 = strcmp((char *)__s1,pNVar2[lVar5].key);
        if (-1 < iVar4) {
          if (iVar4 == 0) {
            return &pNVar2[lVar5].data;
          }
          goto LAB_001055c2;
        }
LAB_001055b8:
        piVar1 = &pNVar2->left;
      }
      else {
        if (lVar3 < *(long *)pNVar2[lVar5].key) goto LAB_001055b8;
LAB_001055c2:
        piVar1 = &pNVar2->right;
      }
      iVar4 = piVar1[lVar5 * 0x107];
    } while (iVar4 != -1);
  }
  return &INDEX_NOT_FOUND;
}

Assistant:

const IndexTree::NodeData &IndexTree::search(const PolarString &key) {
    auto current = *root_node;
    while (current != -1) {
        auto result = fast_string_cmp(key.data(), nodes[current].key);
        if (result == 0) break;
        current = result < 0 ? nodes[current].left : nodes[current].right;
    }
    if (__glibc_unlikely(current == -1)) return INDEX_NOT_FOUND;
    else return nodes[current].data;
}